

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,ByteArray *aBuf)

{
  OptionType aOptionNumber;
  ErrorCode EVar1;
  undefined2 aLastOptionNumber;
  _Rb_tree_color _Var2;
  Error *pEVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  Message *pMVar6;
  Message *__return_storage_ptr___00;
  bool bVar7;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uriPathSegments;
  undefined1 local_90 [40];
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  Serialize((Error *)local_90,this,&this->mHeader,aBuf);
  pMVar6 = (Message *)local_90;
  pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)pMVar6);
  EVar1 = pEVar3->mCode;
  std::__cxx11::string::~string((string *)(local_90 + 8));
  if (EVar1 == kNone) {
    aLastOptionNumber = _S_red;
    p_Var4 = (this->mOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var4 != &(this->mOptions)._M_t._M_impl.super__Rb_tree_header) {
      aOptionNumber = (OptionType)p_Var4[1]._M_color;
      if (aOptionNumber == kUriPath) {
        local_58 = (_Base_ptr)0x0;
        local_68 = (_Base_ptr)&local_68;
        local_60 = (_Base_ptr)&local_68;
        OptionValue::GetStringValue_abi_cxx11_(&local_50,(OptionValue *)&p_Var4[1]._M_parent);
        __return_storage_ptr___00 = (Message *)local_90;
        SplitUriPath((Error *)__return_storage_ptr___00,
                     (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_68,&local_50);
        pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)__return_storage_ptr___00);
        EVar1 = pEVar3->mCode;
        std::__cxx11::string::~string((string *)(local_90 + 8));
        std::__cxx11::string::~string((string *)&local_50);
        p_Var5 = (_Base_ptr)&local_68;
        if (EVar1 == kNone) {
          while( true ) {
            p_Var5 = *(_Base_ptr *)p_Var5;
            bVar7 = p_Var5 == (_Base_ptr)&local_68;
            if (bVar7) break;
            pMVar6 = (Message *)&p_Var5->_M_left;
            _Var2 = p_Var4[1]._M_color;
            OptionValue::OptionValue((OptionValue *)&local_50,(string *)pMVar6);
            __return_storage_ptr___00 = (Message *)local_90;
            Serialize((Error *)__return_storage_ptr___00,pMVar6,(OptionType)_Var2,
                      (OptionValue *)&local_50,aLastOptionNumber,aBuf);
            pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)__return_storage_ptr___00);
            EVar1 = pEVar3->mCode;
            std::__cxx11::string::~string((string *)(local_90 + 8));
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50);
            if (EVar1 != kNone) break;
            aLastOptionNumber = (undefined2)p_Var4[1]._M_color;
          }
        }
        else {
          bVar7 = false;
        }
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_68);
        if (!bVar7) {
          return __return_storage_ptr__;
        }
      }
      else {
        __return_storage_ptr___00 = (Message *)local_90;
        Serialize((Error *)__return_storage_ptr___00,pMVar6,aOptionNumber,
                  (OptionValue *)&p_Var4[1]._M_parent,aLastOptionNumber,aBuf);
        pEVar3 = Error::operator=(__return_storage_ptr__,(Error *)__return_storage_ptr___00);
        EVar1 = pEVar3->mCode;
        std::__cxx11::string::~string((string *)(local_90 + 8));
        if (EVar1 != kNone) {
          return __return_storage_ptr__;
        }
        aLastOptionNumber = (undefined2)p_Var4[1]._M_color;
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      pMVar6 = __return_storage_ptr___00;
    }
    if ((this->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->mPayload).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(aBuf,&kPayloadMarker);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
                 (const_iterator)
                 (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(this->mPayload).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(this->mPayload).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(ByteArray &aBuf) const
{
    Error    error;
    uint16_t lastOptionNumber;

    SuccessOrExit(error = Serialize(mHeader, aBuf));

    lastOptionNumber = 0;
    for (const auto &option : mOptions)
    {
        const auto &number = option.first;
        const auto &value  = option.second;
        if (number == OptionType::kUriPath)
        {
            std::list<std::string> uriPathSegments;
            SuccessOrExit(error = SplitUriPath(uriPathSegments, value.GetStringValue()));
            for (const auto &segment : uriPathSegments)
            {
                SuccessOrExit(error = Serialize(number, OptionValue{segment}, lastOptionNumber, aBuf));
                lastOptionNumber = utils::to_underlying(number);
            }
        }
        else
        {
            SuccessOrExit(error = Serialize(number, value, lastOptionNumber, aBuf));
            lastOptionNumber = utils::to_underlying(number);
        }
    }

    if (!mPayload.empty())
    {
        aBuf.push_back(kPayloadMarker);
        aBuf.insert(aBuf.end(), mPayload.begin(), mPayload.end());
    }

exit:
    return error;
}